

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
               *this,int i)

{
  double dVar1;
  value_type vVar2;
  double dVar3;
  double dVar4;
  value_type vVar5;
  
  vVar2 = FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>
          ::fastAccessDx(&this->left_->fadexpr_,i);
  dVar3 = sin((this->right_->fadexpr_).expr_.val_);
  dVar1 = (this->right_->fadexpr_).expr_.dx_.ptr_to_data[i];
  dVar4 = cos((this->right_->fadexpr_).expr_.val_);
  vVar5 = FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>
          ::val(&this->left_->fadexpr_);
  return vVar5 * dVar4 * dVar1 + dVar3 * vVar2;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}